

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

socket_t __thiscall httplib::ClientImpl::create_client_socket(ClientImpl *this,Error *error)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Error *pEVar5;
  char *ip_00;
  socket_t sVar6;
  Error EVar7;
  const_iterator cVar8;
  long lVar9;
  string **ppsVar10;
  undefined8 *puVar11;
  byte bVar12;
  string ip;
  anon_class_72_9_423fa509 in_stack_fffffffffffffe80;
  _Any_data local_138;
  code *local_128;
  undefined8 local_120;
  time_t local_118;
  time_t local_110;
  time_t local_108;
  time_t local_100;
  time_t local_f8;
  time_t local_f0;
  int local_e4;
  Error *local_e0;
  char *local_d8;
  undefined8 local_d0;
  char local_c8;
  undefined7 uStack_c7;
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  string *local_78;
  time_t *local_70;
  Error *local_68;
  char **local_60;
  time_t *local_58;
  time_t *local_50;
  time_t *local_48;
  time_t *local_40;
  time_t *local_38;
  
  bVar12 = 0;
  local_e0 = error;
  if (((this->proxy_host_)._M_string_length == 0) || (iVar2 = this->proxy_port_, iVar2 == -1)) {
    local_d8 = &local_c8;
    local_d0 = 0;
    local_c8 = '\0';
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->addr_map_)._M_t,&this->host_);
    if ((_Rb_tree_header *)cVar8._M_node != &(this->addr_map_)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::_M_assign((string *)&local_d8);
    }
    ip_00 = local_d8;
    pcVar4 = (this->host_)._M_dataplus._M_p;
    iVar2 = this->port_;
    iVar3 = this->address_family_;
    bVar1 = this->tcp_nodelay_;
    std::function<void_(int)>::function((function<void_(int)> *)&local_b8,&this->socket_options_);
    pEVar5 = local_e0;
    local_f0 = this->connection_timeout_sec_;
    local_f8 = this->connection_timeout_usec_;
    local_100 = this->read_timeout_sec_;
    local_108 = this->read_timeout_usec_;
    local_110 = this->write_timeout_sec_;
    local_118 = this->write_timeout_usec_;
    local_138._M_unused._M_object = (void *)0x0;
    local_138._8_8_ = 0;
    local_128 = (code *)0x0;
    local_120 = uStack_a0;
    if (local_a8 != (code *)0x0) {
      local_138._M_unused._M_object = local_b8._M_unused._M_object;
      local_138._8_8_ = local_b8._8_8_;
      local_128 = local_a8;
      local_a8 = (code *)0x0;
      uStack_a0 = 0;
    }
    local_78 = &this->interface_;
    local_70 = (time_t *)&local_e4;
    local_68 = local_e0;
    local_60 = (char **)&local_f0;
    local_58 = &local_f8;
    local_50 = &local_100;
    local_48 = &local_108;
    local_40 = &local_110;
    local_38 = &local_118;
    ppsVar10 = &local_78;
    puVar11 = (undefined8 *)&stack0xfffffffffffffe80;
    local_e4 = iVar3;
    for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar11 = *ppsVar10;
      ppsVar10 = ppsVar10 + (ulong)bVar12 * -2 + 1;
      puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
    }
    sVar6 = detail::
            create_socket<httplib::detail::create_client_socket(char_const*,char_const*,int,int,bool,std::function<void(int)>,long,long,long,long,long,long,std::__cxx11::string_const&,httplib::Error&)::_lambda(int,addrinfo&)_1_>
                      (pcVar4,ip_00,iVar2,iVar3,0,bVar1,(SocketOptions *)&local_138,
                       in_stack_fffffffffffffe80);
    if (local_128 != (code *)0x0) {
      (*local_128)(&local_138,&local_138,__destroy_functor);
    }
    EVar7 = Success;
    if (sVar6 == -1) {
      if (*pEVar5 != Success) goto LAB_00148360;
      EVar7 = Connection;
    }
    *pEVar5 = EVar7;
LAB_00148360:
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    if (local_d8 == &local_c8) {
      return sVar6;
    }
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
    return sVar6;
  }
  pcVar4 = (this->proxy_host_)._M_dataplus._M_p;
  iVar3 = this->address_family_;
  bVar1 = this->tcp_nodelay_;
  std::function<void_(int)>::function((function<void_(int)> *)&local_98,&this->socket_options_);
  pEVar5 = local_e0;
  local_d8 = (char *)this->connection_timeout_sec_;
  local_f0 = this->connection_timeout_usec_;
  local_f8 = this->read_timeout_sec_;
  local_100 = this->read_timeout_usec_;
  local_108 = this->write_timeout_sec_;
  local_110 = this->write_timeout_usec_;
  local_118 = CONCAT44(local_118._4_4_,iVar3);
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_128 = (code *)0x0;
  local_120 = uStack_80;
  if (local_88 != (code *)0x0) {
    local_138._M_unused._M_object = local_98._M_unused._M_object;
    local_138._8_8_ = local_98._8_8_;
    local_128 = local_88;
    local_88 = (code *)0x0;
    uStack_80 = 0;
  }
  local_78 = &this->interface_;
  local_70 = &local_118;
  local_68 = local_e0;
  local_60 = &local_d8;
  local_58 = &local_f0;
  local_50 = &local_f8;
  local_48 = &local_100;
  local_40 = &local_108;
  local_38 = &local_110;
  ppsVar10 = &local_78;
  puVar11 = (undefined8 *)&stack0xfffffffffffffe80;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    *puVar11 = *ppsVar10;
    ppsVar10 = ppsVar10 + (ulong)bVar12 * -2 + 1;
    puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
  }
  sVar6 = detail::
          create_socket<httplib::detail::create_client_socket(char_const*,char_const*,int,int,bool,std::function<void(int)>,long,long,long,long,long,long,std::__cxx11::string_const&,httplib::Error&)::_lambda(int,addrinfo&)_1_>
                    (pcVar4,"",iVar2,iVar3,0,bVar1,(SocketOptions *)&local_138,
                     in_stack_fffffffffffffe80);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  EVar7 = Success;
  if (sVar6 == -1) {
    if (*pEVar5 != Success) goto LAB_001483ac;
    EVar7 = Connection;
  }
  *pEVar5 = EVar7;
LAB_001483ac:
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  return sVar6;
}

Assistant:

inline socket_t ClientImpl::create_client_socket(Error &error) const {
  if (!proxy_host_.empty() && proxy_port_ != -1) {
    return detail::create_client_socket(
        proxy_host_.c_str(), "", proxy_port_, address_family_, tcp_nodelay_,
        socket_options_, connection_timeout_sec_, connection_timeout_usec_,
        read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
        write_timeout_usec_, interface_, error);
  }

  // Check is custom IP specified for host_
  std::string ip;
  auto it = addr_map_.find(host_);
  if (it != addr_map_.end()) ip = it->second;

  return detail::create_client_socket(
      host_.c_str(), ip.c_str(), port_, address_family_, tcp_nodelay_,
      socket_options_, connection_timeout_sec_, connection_timeout_usec_,
      read_timeout_sec_, read_timeout_usec_, write_timeout_sec_,
      write_timeout_usec_, interface_, error);
}